

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O3

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  node **ppnVar1;
  int iVar2;
  node *pnVar3;
  node *pnVar4;
  int iVar5;
  
  iVar2 = (int)this->mSize + 1;
  if (iVar2 != 0) {
    pnVar3 = this->mHeader;
    pnVar4 = pnVar3;
    iVar5 = iVar2;
    do {
      pnVar4 = pnVar4->next;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (pnVar4 != pnVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"next POINTER ERROR",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      pnVar3 = this->mHeader;
      iVar2 = (int)this->mSize + 1;
    }
    pnVar4 = pnVar3;
    if (iVar2 != 0) {
      do {
        ppnVar1 = &pnVar4->prev;
        iVar2 = iVar2 + -1;
        pnVar4 = *ppnVar1;
      } while (iVar2 != 0);
      if (*ppnVar1 != pnVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"prev POINTER ERROR",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        return;
      }
    }
  }
  return;
}

Assistant:

void check() {
      node* p;
      int n;
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->next;
      if (p != mHeader) {
        std::cout << "next POINTER ERROR" << std::endl;
      }
      p = mHeader;
      n = mSize+1;
      while (n--) p = p->prev;
      if (p != mHeader) {
        std::cout << "prev POINTER ERROR" << std::endl;
      }
    }